

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STInteger.cpp
# Opt level: O3

string * __thiscall
jbcoin::STInteger<unsigned_char>::getText_abi_cxx11_
          (string *__return_storage_ptr__,STInteger<unsigned_char> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  Sink *pSVar5;
  uchar in_DL;
  uchar extraout_DL;
  uchar extraout_DL_00;
  uchar extraout_DL_01;
  uchar extraout_DL_02;
  uchar extraout_DL_03;
  string token;
  uchar local_1e1;
  string local_1e0;
  Stream local_1c0;
  undefined1 local_1b0 [392];
  
  if (((this->super_STBase).fName)->fieldCode == sfTransactionResult) {
    local_1e0._M_string_length = 0;
    local_1e0.field_2._M_local_buf[0] = '\0';
    paVar1 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    bVar3 = transResultInfo((uint)this->value_,&local_1e0,__return_storage_ptr__);
    in_DL = extraout_DL;
    if (!bVar3) {
      debugSink();
      pSVar5 = DebugSink::get(&debugSink::_);
      iVar4 = (*pSVar5->_vptr_Sink[2])(pSVar5,4);
      in_DL = extraout_DL_00;
      if ((char)iVar4 != '\0') {
        debugSink();
        local_1c0.m_sink = DebugSink::get(&debugSink::_);
        local_1c0.m_level = kError;
        beast::Journal::ScopedStream::ScopedStream<char[34]>
                  ((ScopedStream *)local_1b0,&local_1c0,
                   (char (*) [34])"Unknown result code in metadata: ");
        local_1e1 = this->value_;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b0 + 0x10),(char *)&local_1e1,1);
        beast::Journal::ScopedStream::~ScopedStream((ScopedStream *)local_1b0);
        in_DL = extraout_DL_01;
      }
      pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != paVar1) {
        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
        in_DL = extraout_DL_02;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,
                      CONCAT71(local_1e0.field_2._M_allocated_capacity._1_7_,
                               local_1e0.field_2._M_local_buf[0]) + 1);
      in_DL = extraout_DL_03;
    }
    if (bVar3) {
      return __return_storage_ptr__;
    }
  }
  beast::lexicalCastThrow<std::__cxx11::string,unsigned_char>
            (__return_storage_ptr__,(beast *)(ulong)this->value_,in_DL);
  return __return_storage_ptr__;
}

Assistant:

std::string
STUInt8::getText () const
{
    if (getFName () == sfTransactionResult)
    {
        std::string token, human;

        if (transResultInfo (static_cast<TER> (value_), token, human))
            return human;

        JLOG (debugLog().error())
            << "Unknown result code in metadata: " << value_;
    }

    return beast::lexicalCastThrow <std::string> (value_);
}